

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PduHeader.h
# Opt level: O3

void __thiscall
DIS::SimulationManagementPduHeader::setPduHeader(SimulationManagementPduHeader *this,PduHeader *pX)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uint uVar5;
  
  uVar1 = pX->_protocolVersion;
  uVar2 = pX->_exerciseID;
  uVar3 = pX->_pduType;
  uVar4 = pX->_protocolFamily;
  uVar5 = pX->_timestamp;
  *(undefined8 *)((long)&(this->_pduHeader)._timestamp + 1) =
       *(undefined8 *)((long)&pX->_timestamp + 1);
  (this->_pduHeader)._protocolVersion = uVar1;
  (this->_pduHeader)._exerciseID = uVar2;
  (this->_pduHeader)._pduType = uVar3;
  (this->_pduHeader)._protocolFamily = uVar4;
  (this->_pduHeader)._timestamp = uVar5;
  return;
}

Assistant:

class OPENDIS7_EXPORT PduHeader
{
protected:
  /** The version of the protocol. 5=DIS-1995, 6=DIS-1998, 7=DIS-2009. */
  unsigned char _protocolVersion; 

  /** Exercise ID */
  unsigned char _exerciseID; 

  /** Type of pdu, unique for each PDU class */
  unsigned char _pduType; 

  /** value that refers to the protocol family, eg SimulationManagement, etc */
  unsigned char _protocolFamily; 

  /** Timestamp value */
  unsigned int _timestamp; 

  /** Length, in bytes, of the PDU. Changed name from length to avoid use of Hibernate QL reserved word. */
  unsigned char _pduLength; 

  /** PDU Status Record. Described in 6.2.67. This field is not present in earlier DIS versions  */
  unsigned short _pduStatus; 

  /** zero filled array of padding */
  unsigned char _padding; 


 public:
    PduHeader();
    virtual ~PduHeader();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned char getProtocolVersion() const; 
    void setProtocolVersion(unsigned char pX); 

    unsigned char getExerciseID() const; 
    void setExerciseID(unsigned char pX); 

    unsigned char getPduType() const; 
    void setPduType(unsigned char pX); 

    unsigned char getProtocolFamily() const; 
    void setProtocolFamily(unsigned char pX); 

    unsigned int getTimestamp() const; 
    void setTimestamp(unsigned int pX); 

    unsigned char getPduLength() const; 
    void setPduLength(unsigned char pX); 

    unsigned short getPduStatus() const; 
    void setPduStatus(unsigned short pX); 

    unsigned char getPadding() const; 
    void setPadding(unsigned char pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const PduHeader& rhs) const;
}